

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFile.cpp
# Opt level: O0

void __thiscall blc::tools::VFile::~VFile(VFile *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR_write_00130c98;
  std::fstream::close();
  std::__cxx11::string::~string((string *)(in_RDI + 0x48));
  std::__cxx11::string::~string((string *)(in_RDI + 0x43));
  std::fstream::~fstream(in_RDI + 1);
  return;
}

Assistant:

blc::tools::VFile::~VFile() {
	this->_file.close();
}